

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawListSplitter::SetCurrentChannel(ImDrawListSplitter *this,ImDrawList *draw_list,int idx)

{
  int iVar1;
  bool bVar2;
  ImDrawChannel *pIVar3;
  int iVar4;
  ImDrawChannel *pIVar5;
  int idx_local;
  ImDrawList *draw_list_local;
  ImDrawListSplitter *this_local;
  
  bVar2 = false;
  if (-1 < idx) {
    bVar2 = idx < this->_Count;
  }
  if (bVar2) {
    if (this->_Current != idx) {
      pIVar5 = (this->_Channels).Data + this->_Current;
      iVar1 = (draw_list->CmdBuffer).Capacity;
      (pIVar5->_CmdBuffer).Size = (draw_list->CmdBuffer).Size;
      (pIVar5->_CmdBuffer).Capacity = iVar1;
      (pIVar5->_CmdBuffer).Data = (draw_list->CmdBuffer).Data;
      pIVar5 = (this->_Channels).Data;
      iVar1 = this->_Current;
      iVar4 = (draw_list->IdxBuffer).Capacity;
      pIVar3 = pIVar5 + iVar1;
      (pIVar3->_IdxBuffer).Size = (draw_list->IdxBuffer).Size;
      (pIVar3->_IdxBuffer).Capacity = iVar4;
      pIVar5[iVar1]._IdxBuffer.Data = (draw_list->IdxBuffer).Data;
      this->_Current = idx;
      pIVar5 = (this->_Channels).Data + idx;
      iVar1 = (pIVar5->_CmdBuffer).Capacity;
      (draw_list->CmdBuffer).Size = (pIVar5->_CmdBuffer).Size;
      (draw_list->CmdBuffer).Capacity = iVar1;
      (draw_list->CmdBuffer).Data = (pIVar5->_CmdBuffer).Data;
      pIVar5 = (this->_Channels).Data;
      pIVar3 = pIVar5 + idx;
      iVar1 = (pIVar3->_IdxBuffer).Capacity;
      (draw_list->IdxBuffer).Size = (pIVar3->_IdxBuffer).Size;
      (draw_list->IdxBuffer).Capacity = iVar1;
      (draw_list->IdxBuffer).Data = pIVar5[idx]._IdxBuffer.Data;
      draw_list->_IdxWritePtr = (draw_list->IdxBuffer).Data + (draw_list->IdxBuffer).Size;
    }
    return;
  }
  __assert_fail("idx >= 0 && idx < _Count",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui_draw.cpp"
                ,0x51d,"void ImDrawListSplitter::SetCurrentChannel(ImDrawList *, int)");
}

Assistant:

void ImDrawListSplitter::SetCurrentChannel(ImDrawList* draw_list, int idx)
{
    IM_ASSERT(idx >= 0 && idx < _Count);
    if (_Current == idx) 
        return;
    // Overwrite ImVector (12/16 bytes), four times. This is merely a silly optimization instead of doing .swap()
    memcpy(&_Channels.Data[_Current]._CmdBuffer, &draw_list->CmdBuffer, sizeof(draw_list->CmdBuffer));
    memcpy(&_Channels.Data[_Current]._IdxBuffer, &draw_list->IdxBuffer, sizeof(draw_list->IdxBuffer));
    _Current = idx;
    memcpy(&draw_list->CmdBuffer, &_Channels.Data[idx]._CmdBuffer, sizeof(draw_list->CmdBuffer));
    memcpy(&draw_list->IdxBuffer, &_Channels.Data[idx]._IdxBuffer, sizeof(draw_list->IdxBuffer));
    draw_list->_IdxWritePtr = draw_list->IdxBuffer.Data + draw_list->IdxBuffer.Size;
}